

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_restart.c
# Opt level: O0

cupdlp_float
PDHG_Restart_Score_GPU
          (cupdlp_float weightSquared,cupdlp_float dPrimalFeas,cupdlp_float dDualFeas,
          cupdlp_float dDualityGap)

{
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  cupdlp_float dScoreGPU;
  
  dVar1 = sqrt(in_XMM3_Qa * in_XMM3_Qa +
               in_XMM0_Qa * in_XMM1_Qa * in_XMM1_Qa + (in_XMM2_Qa * in_XMM2_Qa) / in_XMM0_Qa);
  return dVar1;
}

Assistant:

cupdlp_float PDHG_Restart_Score_GPU(cupdlp_float weightSquared,
                                    cupdlp_float dPrimalFeas,
                                    cupdlp_float dDualFeas,
                                    cupdlp_float dDualityGap) {
  cupdlp_float dScoreGPU = 0.0;

  dScoreGPU =
      sqrt(weightSquared * dPrimalFeas * dPrimalFeas +
           dDualFeas * dDualFeas / weightSquared + dDualityGap * dDualityGap);

  return dScoreGPU;
}